

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::HTMLTreeRenderer::ToStreamInternal(HTMLTreeRenderer *this,RenderTree *root,ostream *ss)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  idx_t in_R8;
  string head_section;
  string result;
  allocator local_b1;
  allocator local_b0 [32];
  string local_90;
  string local_70;
  string local_50 [32];
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  ::std::__cxx11::string::string
            (local_50,
             "\n<!DOCTYPE html>\n<html lang=\"en\">\n<head>\n    <meta charset=\"UTF-8\">\n    <meta name=\"viewport\" content=\"width=device-width, initial-scale=1.0\">\n    <link rel=\"stylesheet\" href=\"https://unpkg.com/treeflex/dist/css/treeflex.css\">\n    <title>DuckDB Query Plan</title>\n    %s\n</head>\n    "
             ,local_b0);
  ::std::__cxx11::string::string((string *)local_b0,local_50);
  ::std::__cxx11::string::string
            ((string *)&local_70,
             "\n    <style>\n        body {\n            font-family: Arial, sans-serif;\n        }\n\n        .tf-tree .tf-nc {\n            padding: 0px;\n            border: 1px solid #E5E5E5;\n        }\n\n        .tf-nc {\n            border-radius: 0.5rem;\n            padding: 0px;\n            min-width: 150px;\n            width: auto;\n            background-color: #FAFAFA;\n            text-align: center;\n            position: relative;\n        }\n\n        .collapse_button {\n            position:relative;\n            color: black;\n            z-index: 2;\n            width: 2em;\n            background-color: white;\n            height: 2em;\n            border-radius: 50%;\n            top: 2.25em;\n        }\n\n        .collapse_button:hover {\n            background-color: #f0f0f0; /* Light gray */\n        }\n\n        .collapse_button:active {\n            background-color: #e0e0e0; /* Slightly darker gray */\n        }\n\n        .hidden {\n            display: none !important;\n        }\n\n        .title {\n            font-weight: bold;\n            padding-bottom: 5px;\n            color: #fff100;\n            box-sizing: border-box;\n            background-color: black;\n            border-top-left-radius: 0.5rem;\n            border-top-right-radius: 0.5rem;\n            padding: 10px;\n        }\n\n        .content {\n            border-top: 1px solid #000;\n            text-align: center;\n            border-bottom-left-radius: 0.5rem;\n            border-bottom-right-radius: 0.5rem;\n            padding: 10px;\n        }\n\n        .sub-title {\n            color: black;\n            font-weight: bold;\n            padding-top: 5px;\n        }\n\n        .sub-title:not(:first-child) {\n            border-top: 1px solid #ADADAD;\n        }\n\n        .value {\n            margin-left: 10px;\n            margin-top: 5px;\n            color: #3B3B3B;\n            margin-bottom: 5px;\n        }\n\n        .tf-tree {\n            width: 100%;\n            height: 100%;\n            overflow: visible;\n        }\n    </style>\n    "
             ,&local_b1);
  StringUtil::Format<std::__cxx11::string>(&local_90,(StringUtil *)local_b0,&local_70,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)local_b0);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::append((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::string
            (local_50,
             "\n<body>\n    <div class=\"tf-tree\">\n        <ul>%s</ul>\n    </div>\n\n<script>\nfunction toggleDisplay(button) {\n    const parentLi = button.closest(\'li\');\n    const nestedUl = parentLi.querySelector(\'ul\');\n    if (nestedUl) {\n        const currentDisplay = getComputedStyle(nestedUl).getPropertyValue(\'display\');\n        if (currentDisplay === \'none\') {\n            nestedUl.classList.toggle(\'hidden\');\n            button.textContent = \'-\';\n        } else {\n            nestedUl.classList.toggle(\'hidden\');\n            button.textContent = \'+\';\n        }\n    }\n}\n</script>\n\n</body>\n</html>\n    "
             ,local_b0);
  ::std::__cxx11::string::string((string *)local_b0,local_50);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  CreateTreeRecursive_abi_cxx11_(&local_70,(duckdb *)root,(RenderTree *)0x0,0,in_R8);
  StringUtil::Format<std::__cxx11::string>(&local_90,(StringUtil *)local_b0,&local_70,params);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)local_b0);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::append((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::operator<<(ss,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HTMLTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	string result;
	result += CreateHeadSection(root);
	result += CreateBodySection(root);
	ss << result;
}